

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

void EmitDestructuredObject
               (ParseNode *lhs,RegSlot rhsLocationOrig,ByteCodeGenerator *byteCodeGenerator,
               FuncInfo *funcInfo)

{
  ByteCodeWriter *this;
  char cVar1;
  ParseNode *this_00;
  code *pcVar2;
  bool bVar3;
  ByteCodeLabel labelID;
  RegSlot RVar4;
  undefined4 *puVar5;
  ParseNodeObjLit *pPVar6;
  uint *buffer;
  ParseNodeBin *pPVar7;
  char *byteCodeGenerator_00;
  FuncInfo *pFVar8;
  FuncInfo *pFVar9;
  ByteCodeGenerator *node;
  uint uVar10;
  uint32 staticCount;
  ParseNodePtr *item;
  anon_class_56_7_8c365b3e local_d8;
  anon_class_8_1_aca58a2a local_a0;
  FuncInfo *local_98;
  uint32 local_8c;
  ByteCodeGenerator *pBStack_88;
  uint32 index;
  ByteCodeGenerator *local_80;
  ByteCodeGenerator *byteCodeGenerator_local;
  ulong local_70;
  uint local_64;
  FuncInfo *local_60;
  FuncInfo *local_58;
  FuncInfo *funcInfo_local;
  RegSlot local_44;
  RegSlot local_40;
  RegSlot rhsLocation;
  RegSlot propIdArrLocation;
  bool local_32;
  bool local_31;
  RegSlot computedPropIdArrLocation;
  bool hasRest;
  bool hasComputedProps;
  
  local_80 = byteCodeGenerator;
  local_60 = funcInfo;
  local_58 = funcInfo;
  rhsLocation = rhsLocationOrig;
  if (lhs->nop != knopObjectPattern) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x1bdf,"(lhs->nop == knopObjectPattern)","lhs->nop == knopObjectPattern");
    if (!bVar3) goto LAB_00768178;
    *puVar5 = 0;
  }
  pPVar6 = ParseNode::AsParseNodeObjLit(lhs);
  funcInfo_local = (FuncInfo *)(pPVar6->super_ParseNodeUni).pnode1;
  local_70 = (ulong)pPVar6->staticCount;
  local_64 = pPVar6->computedCount;
  bVar3 = pPVar6->hasRest;
  local_31 = false;
  byteCodeGenerator_local = (ByteCodeGenerator *)lhs;
  local_32 = bVar3;
  ByteCodeGenerator::StartStatement(byteCodeGenerator,lhs);
  this = &byteCodeGenerator->m_writer;
  pBStack_88 = byteCodeGenerator;
  labelID = Js::ByteCodeWriter::DefineLabel(this);
  pFVar9 = local_60;
  RVar4 = FuncInfo::AcquireTmpRegister(local_60);
  local_44 = RVar4;
  Js::ByteCodeWriter::Reg2(this,Ld_A,RVar4,rhsLocation);
  Js::ByteCodeWriter::BrReg2(this,BrNeq_A,labelID,RVar4,pFVar9->undefinedConstantRegister);
  Js::ByteCodeWriter::W1(this,RuntimeTypeError,0x1610);
  pFVar9 = funcInfo_local;
  Js::ByteCodeWriter::MarkLabel(this,labelID);
  pFVar8 = local_60;
  node = byteCodeGenerator_local;
  if (pFVar9 != (FuncInfo *)0x0) {
    local_40 = 0xffffffff;
    propIdArrLocation = 0xffffffff;
    if (bVar3 != false) {
      uVar10 = (uint)local_70;
      if (0x3fffffff < uVar10) {
        Math::DefaultOverflowPolicy();
      }
      rhsLocation = UInt32Math::Add(8,uVar10 * 4);
      byteCodeGenerator_00 = (char *)0x8;
      buffer = (uint *)new<Memory::ArenaAllocator>(8,pBStack_88->alloc,0x35916e,0);
      pFVar8 = local_60;
      *buffer = uVar10;
      buffer[1] = 0;
      cVar1 = (char)pFVar9->inlineCacheCount;
      if (((cVar1 != '\x11') && (cVar1 != 'P')) && (cVar1 != 'q')) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar5 = 1;
        byteCodeGenerator_00 =
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
        ;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x1bfa,
                           "(pnode1->nop == knopList || pnode1->nop == knopObjectPatternMember || pnode1->nop == knopEllipsis)"
                           ,
                           "pnode1->nop == knopList || pnode1->nop == knopObjectPatternMember || pnode1->nop == knopEllipsis"
                          );
        if (!bVar3) {
LAB_00768178:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar5 = 0;
      }
      staticCount = (uint32)local_70;
      EmitObjectPropertyIdsToArray
                ((ByteCodeGenerator *)byteCodeGenerator_00,(PropertyId *)(buffer + 2),
                 (ParseNodePtr)funcInfo_local,staticCount,&local_31);
      RVar4 = FuncInfo::AcquireTmpRegister(pFVar8);
      local_40 = RVar4;
      Js::ByteCodeWriter::Auxiliary(this,LdPropIds,RVar4,buffer,rhsLocation,staticCount);
      if (local_31 == true) {
        propIdArrLocation = FuncInfo::AcquireTmpRegister(pFVar8);
        Js::ByteCodeWriter::Reg1Unsigned1(this,NewPropIdArrForCompProps,propIdArrLocation,local_64);
        pFVar9 = funcInfo_local;
      }
      else {
        propIdArrLocation = RVar4;
        pFVar9 = funcInfo_local;
      }
    }
    node = byteCodeGenerator_local;
    local_d8.index = &local_8c;
    local_8c = 0;
    local_d8.rhsLocation = &local_44;
    local_a0.handler = &local_d8;
    local_d8.propIdArrLocation = &local_40;
    local_d8.computedPropIdArrLocation = &propIdArrLocation;
    local_d8.hasRest = &local_32;
    local_d8.byteCodeGenerator = &local_80;
    local_d8.funcInfo = &local_58;
    item = (ParseNodePtr *)&local_98;
    local_98 = pFVar9;
    while ((item != (ParseNodePtr *)0x0 && (this_00 = *item, this_00 != (ParseNode *)0x0))) {
      if (this_00->nop == knopList) {
        pPVar7 = ParseNode::AsParseNodeBin(this_00);
        Parser::
        ForEachItemInList<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp:7182:43)>
        ::anon_class_8_1_aca58a2a::operator()(&local_a0,&pPVar7->pnode1);
        pPVar7 = ParseNode::AsParseNodeBin(*item);
        item = &pPVar7->pnode2;
      }
      else {
        Parser::
        ForEachItemInList<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp:7182:43)>
        ::anon_class_8_1_aca58a2a::operator()(&local_a0,item);
        item = (ParseNodePtr *)0x0;
      }
    }
    pFVar8 = local_58;
    RVar4 = local_44;
    if (local_32 == true) {
      if (local_31 == true) {
        FuncInfo::ReleaseTmpRegister(local_58,propIdArrLocation);
      }
      FuncInfo::ReleaseTmpRegister(local_58,local_40);
      pFVar8 = local_58;
      RVar4 = local_44;
    }
  }
  FuncInfo::ReleaseTmpRegister(pFVar8,RVar4);
  Js::ByteCodeWriter::EndStatement(&local_80->m_writer,(ParseNode *)node);
  return;
}

Assistant:

void EmitDestructuredObject(ParseNode *lhs,
    Js::RegSlot rhsLocationOrig,
    ByteCodeGenerator *byteCodeGenerator,
    FuncInfo *funcInfo)
{
    Assert(lhs->nop == knopObjectPattern);
    ParseNodeObjLit *pnodeObjLit = lhs->AsParseNodeObjLit();
    ParseNodePtr pnode1 = pnodeObjLit->pnode1;
    uint32 staticCount = pnodeObjLit->staticCount;
    uint32 computedCount = pnodeObjLit->computedCount;
    bool hasRest = pnodeObjLit->hasRest;
    bool hasComputedProps = false;

    byteCodeGenerator->StartStatement(lhs);

    Js::ByteCodeLabel skipThrow = byteCodeGenerator->Writer()->DefineLabel();
    Js::RegSlot rhsLocation = funcInfo->AcquireTmpRegister();
    byteCodeGenerator->Writer()->Reg2(Js::OpCode::Ld_A, rhsLocation, rhsLocationOrig);
    byteCodeGenerator->Writer()->BrReg2(Js::OpCode::BrNeq_A, skipThrow, rhsLocation, funcInfo->undefinedConstantRegister);
    byteCodeGenerator->Writer()->W1(Js::OpCode::RuntimeTypeError, SCODE_CODE(JSERR_ObjectCoercible));
    byteCodeGenerator->Writer()->MarkLabel(skipThrow);

    if (pnode1 != nullptr)
    {
        Js::RegSlot propIdArrLocation = Js::Constants::NoRegister;
        Js::RegSlot computedPropIdArrLocation = Js::Constants::NoRegister;
        if (hasRest)
        {
            uint extraAlloc = UInt32Math::Mul(staticCount, sizeof(Js::PropertyId));
            uint auxSize = UInt32Math::Add(sizeof(Js::PropertyIdArray), extraAlloc);
            Js::PropertyIdArray *propIds = AnewPlus(byteCodeGenerator->GetAllocator(), extraAlloc, Js::PropertyIdArray, staticCount, 0);

            Assert(pnode1->nop == knopList || pnode1->nop == knopObjectPatternMember || pnode1->nop == knopEllipsis);

            EmitObjectPropertyIdsToArray(byteCodeGenerator, propIds->elements, pnode1, staticCount, &hasComputedProps);

            // Load static PropertyIdArray here
            propIdArrLocation = funcInfo->AcquireTmpRegister();
            byteCodeGenerator->Writer()->Auxiliary(Js::OpCode::LdPropIds, propIdArrLocation, propIds, auxSize, staticCount);

            if (hasComputedProps)
            {
                computedPropIdArrLocation = funcInfo->AcquireTmpRegister();
                byteCodeGenerator->Writer()->Reg1Unsigned1(Js::OpCode::NewPropIdArrForCompProps, computedPropIdArrLocation, computedCount);
            }
            else
            {
                computedPropIdArrLocation = propIdArrLocation;
            }
        }

        uint32 index = 0;
        Parser::ForEachItemInList(pnode1, [&](ParseNodePtr memberNode) {
            EmitDestructuredObjectMember(memberNode, rhsLocation, propIdArrLocation, computedPropIdArrLocation, 
                &index, hasRest, byteCodeGenerator, funcInfo);
        });

        if (hasRest)
        {
            if (hasComputedProps)
            {
                funcInfo->ReleaseTmpRegister(computedPropIdArrLocation);
            }
            funcInfo->ReleaseTmpRegister(propIdArrLocation);
        }
    }

    funcInfo->ReleaseTmpRegister(rhsLocation);
    
    byteCodeGenerator->EndStatement(lhs);
}